

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

size_t __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::findParent
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  pointer puVar1;
  Index IVar2;
  Index IVar3;
  
  IVar2 = andres::Partition<unsigned_long>::find(&this->partition_,v);
  IVar3 = andres::Partition<unsigned_long>::find
                    (&this->partition_,
                     (this->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[IVar2]);
  puVar1 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1[IVar2] != IVar3) {
    puVar1[IVar2] = IVar3;
  }
  if (IVar3 != IVar2) {
    v = IVar3;
  }
  return v;
}

Assistant:

inline size_t findParent(size_t v)
    {
        auto rep = findRep(v);
        auto parent = findRep(parents_[rep]);

        if (parents_[rep] != parent) { // update lookup.
            parents_[rep] = parent;
        }

        if (parent == rep) {
            return v;
        } else {
            return parent;
        }
    }